

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSlab::~IfcSlab(IfcSlab *this)

{
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  plVar1 = (long *)(&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x20 +
                   lVar2);
  plVar1[-0x2d] = 0x889b60;
  plVar1[3] = 0x889c78;
  plVar1[-0x1c] = 0x889b88;
  plVar1[-0x1a] = 0x889bb0;
  plVar1[-0x13] = 0x889bd8;
  plVar1[-0xd] = 0x889c00;
  plVar1[-6] = 0x889c28;
  plVar1[-4] = 0x889c50;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)(&this->field_0x0 + lVar2),&PTR_construction_vtable_24__00889c98);
  operator_delete((IfcElement *)(&this->field_0x0 + lVar2),0x198);
  return;
}

Assistant:

IfcSlab() : Object("IfcSlab") {}